

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  char cVar1;
  int iVar2;
  reference piVar3;
  const_reference pvVar4;
  reference piVar5;
  int *piVar6;
  byte in_R8B;
  int in_R9D;
  int old;
  size_t x;
  int prev;
  int best;
  size_t y;
  int i;
  SmallVector<int,_32UL> row;
  size_t n;
  size_t m;
  int *in_stack_fffffffffffffe38;
  SmallVectorBase<int> *in_stack_fffffffffffffe40;
  int local_114;
  int local_110;
  int local_10c;
  size_type local_108;
  int local_100;
  int local_fc;
  ulong local_f8;
  int local_e0;
  SmallVector<int,_32UL> local_d8;
  size_type local_40;
  size_type local_38;
  int local_30;
  byte local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  int local_4;
  
  local_29 = in_R8B & 1;
  local_30 = in_R9D;
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  SmallVector<int,_32UL>::SmallVector(&local_d8,local_40);
  for (local_e0 = 0; local_e0 <= (int)local_40; local_e0 = local_e0 + 1) {
    SmallVectorBase<int>::push_back(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  local_f8 = 1;
  do {
    if (local_38 < local_f8) {
      piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_40);
      local_4 = *piVar3;
LAB_003df4e3:
      SmallVector<int,_32UL>::~SmallVector((SmallVector<int,_32UL> *)0x3df4f0);
      return local_4;
    }
    iVar2 = (int)local_f8;
    piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,0);
    *piVar3 = iVar2;
    piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,0);
    local_fc = *piVar3;
    local_100 = (int)local_f8 + -1;
    for (local_108 = 1; local_108 <= local_40; local_108 = local_108 + 1) {
      piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
      iVar2 = local_100;
      local_10c = *piVar3;
      if ((local_29 & 1) == 0) {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_18,local_f8 - 1);
        cVar1 = *pvVar4;
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_28,local_108 - 1);
        iVar2 = local_100;
        if (cVar1 == *pvVar4) {
          piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
          *piVar3 = iVar2;
        }
        else {
          piVar3 = SmallVectorBase<int>::operator[]
                             (&local_d8.super_SmallVectorBase<int>,local_108 - 1);
          piVar5 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
          piVar6 = std::min<int>(piVar3,piVar5);
          iVar2 = *piVar6;
          piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
          *piVar3 = iVar2 + 1;
        }
      }
      else {
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_18,local_f8 - 1);
        cVar1 = *pvVar4;
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_28,local_108 - 1);
        local_110 = iVar2 + (uint)(cVar1 != *pvVar4);
        piVar3 = SmallVectorBase<int>::operator[]
                           (&local_d8.super_SmallVectorBase<int>,local_108 - 1);
        piVar5 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
        piVar6 = std::min<int>(piVar3,piVar5);
        local_114 = *piVar6 + 1;
        piVar6 = std::min<int>(&local_110,&local_114);
        iVar2 = *piVar6;
        piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
        *piVar3 = iVar2;
      }
      local_100 = local_10c;
      piVar3 = SmallVectorBase<int>::operator[](&local_d8.super_SmallVectorBase<int>,local_108);
      piVar6 = std::min<int>(&local_fc,piVar3);
      local_fc = *piVar6;
    }
    if ((local_30 != 0) && (local_30 < local_fc)) {
      local_4 = local_30 + 1;
      goto LAB_003df4e3;
    }
    local_f8 = local_f8 + 1;
  } while( true );
}

Assistant:

int editDistance(std::string_view left, std::string_view right, bool allowReplacements,
                 int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}